

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_sockaddr_ex *addr;
  uint *sockfd;
  undefined1 *puVar1;
  uchar uVar2;
  void *pvVar3;
  void *pvVar4;
  connectdata *pcVar5;
  bool bVar6;
  _Bool _Var7;
  uchar uVar8;
  CURLcode CVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  if2ip_result_t iVar14;
  int *piVar15;
  uint *puVar16;
  size_t sVar17;
  ulong uVar18;
  socklen_t __len;
  byte *__s;
  char *pcVar19;
  ushort uVar20;
  char *__nptr;
  curltime cVar21;
  uint local_25c;
  Curl_dns_entry *h;
  int local_244;
  int on;
  curl_socklen_t size;
  curl_socklen_t onoff;
  undefined1 auStack_234 [4];
  char acStack_230 [16];
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  char buffer [256];
  Curl_sockaddr_storage add;
  
  pvVar3 = cf->ctx;
  cVar21 = Curl_now();
  *(time_t *)((long)pvVar3 + 0x148) = cVar21.tv_sec;
  *(int *)((long)pvVar3 + 0x150) = cVar21.tv_usec;
  addr = (Curl_sockaddr_ex *)((long)pvVar3 + 8);
  sockfd = (uint *)((long)pvVar3 + 0x98);
  CVar9 = socket_open(data,addr,(curl_socket_t *)sockfd);
  if (CVar9 == CURLE_OK) {
    pvVar4 = cf->ctx;
    _Var7 = Curl_addr2string((sockaddr *)((long)pvVar4 + 0x18),
                             *(curl_socklen_t *)((long)pvVar4 + 0x14),(char *)((long)pvVar4 + 0xe0),
                             (int *)((long)pvVar4 + 0x110));
    if (_Var7) {
      uVar10 = addr->family;
      if (uVar10 == 10) {
        if (data != (Curl_easy *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            pcVar19 = "  Trying [%s]:%d...";
LAB_00150527:
            Curl_infof(data,pcVar19,(long)pvVar3 + 0xe0,(ulong)*(uint *)((long)pvVar3 + 0x110));
          }
LAB_0015053f:
          uVar10 = addr->family;
          goto LAB_00150543;
        }
LAB_0015054f:
        if (*(int *)((long)pvVar3 + 0xc) == 1) {
          uVar18 = *(ulong *)&(data->set).field_0x8ba;
          if ((uVar18 >> 0x21 & 1) != 0) {
            onoff = 1;
            iVar11 = setsockopt(*sockfd,6,1,&onoff,4);
            uVar18 = *(ulong *)&(data->set).field_0x8ba;
            if (((uint)uVar18 >> 0x1c & 1) != 0 && iVar11 < 0) {
              piVar15 = __errno_location();
              pcVar19 = Curl_strerror(*piVar15,buffer,0x100);
              Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar19);
              uVar18 = *(ulong *)&(data->set).field_0x8ba;
            }
          }
          if ((uVar18 >> 0x27 & 1) != 0) {
            uVar10 = *sockfd;
            buffer[0] = '\x01';
            buffer[1] = '\0';
            buffer[2] = '\0';
            buffer[3] = '\0';
            iVar11 = setsockopt(uVar10,1,9,buffer,4);
            if (iVar11 < 0) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                pcVar19 = "Failed to set SO_KEEPALIVE on fd %d: errno %d";
                goto LAB_001506a2;
              }
            }
            else {
              buffer._0_4_ = curlx_sltosi((long)(data->set).tcp_keepidle);
              iVar11 = setsockopt(uVar10,6,4,buffer,4);
              if ((iVar11 < 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                puVar16 = (uint *)__errno_location();
                Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d: errno %d",(ulong)uVar10,
                           (ulong)*puVar16);
              }
              buffer._0_4_ = curlx_sltosi((long)(data->set).tcp_keepintvl);
              iVar11 = setsockopt(uVar10,6,5,buffer,4);
              if ((iVar11 < 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                pcVar19 = "Failed to set TCP_KEEPINTVL on fd %d: errno %d";
LAB_001506a2:
                puVar16 = (uint *)__errno_location();
                Curl_infof(data,pcVar19,(ulong)uVar10,(ulong)*puVar16);
              }
            }
          }
        }
      }
      else {
        if (data != (Curl_easy *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            pcVar19 = "  Trying %s:%d...";
            goto LAB_00150527;
          }
          goto LAB_0015053f;
        }
LAB_00150543:
        if ((uVar10 | 8) == 10) goto LAB_0015054f;
      }
      if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
        bVar6 = false;
      }
      else {
        Curl_set_in_callback(data,true);
        iVar11 = (*(data->set).fsockopt)((data->set).sockopt_client,*sockfd,CURLSOCKTYPE_IPCXN);
        Curl_set_in_callback(data,false);
        if (iVar11 == 2) {
          bVar6 = true;
        }
        else {
          if (iVar11 != 0) {
            CVar9 = CURLE_ABORTED_BY_CALLBACK;
            goto LAB_00150bf2;
          }
          bVar6 = false;
        }
      }
      uVar10 = addr->family;
      if ((uVar10 | 8) == 10) {
        pcVar5 = cf->conn;
        iVar11 = *(int *)((long)pvVar3 + 0x98);
        uVar12 = Curl_ipv6_scope((sockaddr *)((long)pvVar3 + 0x18));
        h = (Curl_dns_entry *)0x0;
        uVar20 = (data->set).localport;
        __s = (byte *)(data->set).str[8];
        on = 1;
        if (uVar20 != 0 || __s != (byte *)0x0) {
          local_25c = (uint)(data->set).localportrange;
          local_1c8 = 0;
          uStack_1c0 = 0;
          local_1d8 = 0;
          uStack_1d0 = 0;
          local_1e8 = 0;
          uStack_1e0 = 0;
          local_1f8 = 0;
          uStack_1f0 = 0;
          local_208 = 0;
          uStack_200 = 0;
          local_218 = 0;
          uStack_210 = 0;
          acStack_230[8] = '\0';
          acStack_230[9] = '\0';
          acStack_230[10] = '\0';
          acStack_230[0xb] = '\0';
          acStack_230[0xc] = '\0';
          acStack_230[0xd] = '\0';
          acStack_230[0xe] = '\0';
          acStack_230[0xf] = '\0';
          uStack_220 = 0;
          onoff._0_2_ = 0;
          onoff._2_1_ = '\0';
          onoff._3_1_ = '\0';
          auStack_234[0] = '\0';
          auStack_234[1] = '\0';
          auStack_234[2] = '\0';
          auStack_234[3] = '\0';
          acStack_230[0] = '\0';
          acStack_230[1] = '\0';
          acStack_230[2] = '\0';
          acStack_230[3] = '\0';
          acStack_230[4] = '\0';
          acStack_230[5] = '\0';
          acStack_230[6] = '\0';
          acStack_230[7] = '\0';
          if ((__s == (byte *)0x0) || (sVar17 = strlen((char *)__s), 0xfe < sVar17)) {
            if (uVar10 == 2) {
LAB_00150b18:
              onoff = CONCAT22(uVar20 << 8 | uVar20 >> 8,2);
              __len = 0x10;
            }
            else {
              __len = 0;
              if (uVar10 == 10) {
                onoff = CONCAT22(uVar20 << 8 | uVar20 >> 8,10);
                __len = 0x1c;
              }
            }
LAB_00150b2d:
            setsockopt(iVar11,0,0x18,&on,4);
            uVar10 = (uint)uVar20;
            while( true ) {
              uVar12 = uVar10 + 1;
              iVar13 = bind(iVar11,(sockaddr *)&onoff,__len);
              if (-1 < iVar13) break;
              if (((int)local_25c < 2) || (uVar20 = (ushort)uVar12, uVar20 == 0)) {
                puVar16 = (uint *)__errno_location();
                uVar10 = *puVar16;
                (data->state).os_errno = uVar10;
                pcVar19 = Curl_strerror(uVar10,buffer,0x100);
                Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar10,pcVar19);
                CVar9 = CURLE_INTERFACE_FAILED;
                goto LAB_00150bf2;
              }
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Bind to local port %d failed, trying next",
                           (ulong)((uVar12 & 0xffff) - 1));
              }
              onoff = CONCAT22(uVar20 << 8 | uVar20 >> 8,(sa_family_t)onoff);
              local_25c = local_25c - 1;
              uVar10 = uVar12;
            }
            size = 0x80;
            add.buffer._0_8_ = 0;
            add.buffer._8_1_ = '\0';
            add.buffer._9_1_ = '\0';
            add.buffer._10_1_ = '\0';
            add.buffer._11_1_ = '\0';
            add.buffer._12_1_ = '\0';
            add.buffer._13_1_ = '\0';
            add.buffer._14_1_ = '\0';
            add.buffer._15_1_ = '\0';
            add.buffer._16_8_ = 0;
            add.buffer._24_8_ = 0;
            add.buffer._32_8_ = 0;
            add.buffer._40_8_ = 0;
            add.buffer._48_8_ = 0;
            add.buffer._56_8_ = 0;
            add.buffer._64_8_ = 0;
            add.buffer._72_8_ = 0;
            add.buffer._80_8_ = 0;
            add.buffer._88_8_ = 0;
            add.buffer._96_8_ = 0;
            add.buffer._104_8_ = 0;
            add.buffer._112_8_ = 0;
            add.buffer.sa_stor.__ss_align = 0;
            iVar11 = getsockname(iVar11,(sockaddr *)&add,&size);
            if (iVar11 < 0) {
              puVar16 = (uint *)__errno_location();
              uVar10 = *puVar16;
              (data->state).os_errno = uVar10;
              pcVar19 = Curl_strerror(uVar10,buffer,0x100);
              Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar10,pcVar19);
              goto LAB_00150d0a;
            }
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"Local port: %hu",(ulong)uVar10);
            }
            puVar1 = &(pcVar5->bits).field_0x2;
            *puVar1 = *puVar1 | 0x40;
            CVar9 = CURLE_OK;
          }
          else {
            memset(buffer,0,0x100);
            local_244 = *__s - 0x69;
            if ((local_244 == 0) && (local_244 = __s[1] - 0x66, local_244 == 0)) {
              local_244 = 0x21 - (uint)__s[2];
            }
            else {
              local_244 = -local_244;
            }
            CVar9 = CURLE_UNSUPPORTED_PROTOCOL;
            if (local_244 != 0) {
              iVar13 = strncmp("host!",(char *)__s,5);
              if (iVar13 != 0) goto LAB_001508f8;
              __s = __s + 5;
              goto LAB_001509d5;
            }
            __s = __s + 3;
LAB_001508f8:
            sVar17 = strlen((char *)__s);
            iVar13 = setsockopt(iVar11,1,0x19,__s,(int)sVar17 + 1);
            if (iVar13 == 0) {
              CVar9 = CURLE_OK;
              if (((data->set).field_0x8bd & 0x10) != 0) {
                CVar9 = CURLE_OK;
                Curl_infof(data,"socket successfully bound to interface \'%s\'",__s);
              }
              goto LAB_00150d0e;
            }
            iVar14 = Curl_if2ip(uVar10,uVar12,pcVar5->scope_id,(char *)__s,buffer,0x100);
            if (iVar14 == IF2IP_FOUND) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Local Interface %s is ip %s using address family %i",__s,buffer,
                           (ulong)uVar10);
              }
LAB_00150a9f:
              __len = 0;
              if (uVar10 == 2) {
                iVar13 = inet_pton(2,buffer,auStack_234);
                if (0 < iVar13) goto LAB_00150b18;
              }
              else {
                __len = 0;
                if (uVar10 == 10) {
                  pcVar19 = strchr(buffer,0x25);
                  if (pcVar19 == (char *)0x0) {
                    __nptr = (char *)0x0;
                  }
                  else {
                    __nptr = pcVar19 + 1;
                    *pcVar19 = '\0';
                  }
                  iVar13 = inet_pton(10,buffer,acStack_230);
                  __len = 0x1c;
                  if (0 < iVar13) {
                    onoff = CONCAT22(uVar20 << 8 | uVar20 >> 8,10);
                    if (__nptr != (char *)0x0) {
                      uVar18 = strtoul(__nptr,(char **)0x0,10);
                      if (uVar18 >> 0x20 != 0) goto LAB_00150d0e;
                      uStack_220 = CONCAT44(uStack_220._4_4_,(int)uVar18);
                    }
                  }
                }
              }
              goto LAB_00150b2d;
            }
            if (iVar14 == IF2IP_AF_NOT_SUPPORTED) {
              CVar9 = CURLE_UNSUPPORTED_PROTOCOL;
              goto LAB_00150d0e;
            }
            if (iVar14 == IF2IP_NOT_FOUND) {
              if (local_244 != 0) {
LAB_001509d5:
                uVar2 = pcVar5->ip_version;
                if (uVar10 == 2) {
                  uVar8 = '\x01';
LAB_001509f6:
                  pcVar5->ip_version = uVar8;
                }
                else if (uVar10 == 10) {
                  uVar8 = '\x02';
                  goto LAB_001509f6;
                }
                Curl_resolv(data,(char *)__s,0x50,false,&h);
                pcVar5->ip_version = uVar2;
                if (h != (Curl_dns_entry *)0x0) {
                  Curl_printable_address(h->addr,buffer,0x100);
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",__s,
                               (ulong)uVar10,buffer,(ulong)(uint)h->addr->ai_family);
                  }
                  Curl_resolv_unlock(data,h);
                  if (h->addr->ai_family != uVar10) goto LAB_00150d0e;
                  goto LAB_00150a9f;
                }
                goto LAB_00150ad9;
              }
              pcVar19 = "Couldn\'t bind to interface \'%s\'";
            }
            else {
              if (local_244 != 0) goto LAB_001509d5;
LAB_00150ad9:
              puVar1 = &(data->state).field_0x74c;
              *puVar1 = *puVar1 & 0xf7;
              pcVar19 = "Couldn\'t bind to \'%s\'";
            }
            Curl_failf(data,pcVar19,__s);
LAB_00150d0a:
            CVar9 = CURLE_INTERFACE_FAILED;
          }
LAB_00150d0e:
          if (CVar9 != CURLE_OK) {
            if (CVar9 == CURLE_UNSUPPORTED_PROTOCOL) {
              CVar9 = CURLE_COULDNT_CONNECT;
            }
            goto LAB_00150bf2;
          }
        }
      }
      curlx_nonblock(*(curl_socket_t *)((long)pvVar3 + 0x98),1);
      *(byte *)((long)pvVar3 + 0x17c) =
           *(byte *)((long)pvVar3 + 0x17c) & 0xfb | (*(int *)((long)pvVar3 + 0xc) != 2) << 2;
      CVar9 = CURLE_OK;
      if (bVar6) {
        set_local_ip(cf,data);
        cVar21 = Curl_now();
        *(time_t *)((long)pvVar3 + 0x158) = cVar21.tv_sec;
        *(int *)((long)pvVar3 + 0x160) = cVar21.tv_usec;
        cf->field_0x24 = cf->field_0x24 | 1;
      }
      goto LAB_00150c12;
    }
    puVar16 = (uint *)__errno_location();
    uVar10 = *puVar16;
    *(uint *)((long)pvVar4 + 0x178) = uVar10;
    pcVar19 = Curl_strerror(uVar10,buffer,0x100);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar10,pcVar19);
    CVar9 = CURLE_FAILED_INIT;
  }
LAB_00150bf2:
  if (*sockfd != 0xffffffff) {
    socket_close(data,cf->conn,1,*sockfd);
    *sockfd = 0xffffffff;
  }
  if (data == (Curl_easy *)0x0) {
    return CVar9;
  }
LAB_00150c12:
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",(ulong)CVar9,(ulong)*sockfd);
  }
  return CVar9;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
  result = socket_open(data, &ctx->addr, &ctx->sock);
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef ENABLE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->r_ip, ctx->r_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->r_ip, ctx->r_port);

#ifdef ENABLE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbufset(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef ENABLE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

  /* set socket non-blocking */
  (void)curlx_nonblock(ctx->sock, TRUE);
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" CURL_FORMAT_SOCKET_T,
              result, ctx->sock);
  return result;
}